

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::generate_service_interface(t_perl_generator *this,t_service *tservice)

{
  t_function *tfunction;
  bool bVar1;
  int iVar2;
  t_program *p;
  undefined4 extraout_var;
  ostream *poVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar4;
  allocator local_169;
  string local_168;
  string local_148;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_128;
  t_function **local_120;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_118;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  t_service *local_58;
  t_service *extends_s;
  allocator local_39;
  string local_38 [8];
  string extends_if;
  t_service *tservice_local;
  t_perl_generator *this_local;
  
  extends_if.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58 = t_service::get_extends((t_service *)extends_if.field_2._8_8_);
  if (local_58 != (t_service *)0x0) {
    p = t_type::get_program(&local_58->super_t_type);
    perl_namespace_abi_cxx11_(&local_d8,this,p);
    std::operator+(&local_b8,"use base qw(",&local_d8);
    iVar2 = (*(local_58->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar2));
    std::operator+(&local_78,&local_98,"If);");
    std::__cxx11::string::operator=(local_38,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  poVar3 = std::operator<<((ostream *)&this->f_service_,"package ");
  perl_namespace_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this,
             (this->super_t_oop_generator).super_t_generator.program_);
  poVar3 = std::operator<<(poVar3,(string *)
                                  &functions.
                                   super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar3 = std::operator<<(poVar3,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar3 = std::operator<<(poVar3,"If;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"use strict;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,local_38);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  t_generator::indent_up((t_generator *)this);
  __x = t_service::get_functions((t_service *)extends_if.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_118);
  local_120 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_118._M_current = local_120;
  while( true ) {
    local_128._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_118,&local_128);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)&this->f_service_,"sub ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_118);
    tfunction = *pptVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"",&local_169);
    function_signature(&local_148,this,tfunction,&local_168);
    poVar3 = std::operator<<(poVar3,(string *)&local_148);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"  die \'implement interface\';\n}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_118);
  }
  t_generator::indent_down((t_generator *)this);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void t_perl_generator::generate_service_interface(t_service* tservice) {
  string extends_if = "";
  t_service* extends_s = tservice->get_extends();
  if (extends_s != nullptr) {
    extends_if = "use base qw(" + perl_namespace(extends_s->get_program()) + extends_s->get_name()
                 + "If);";
  }

  f_service_ << "package " << perl_namespace(program_) << service_name_ << "If;" << endl << endl
             << "use strict;" << endl << extends_if << endl << endl;

  indent_up();
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << "sub " << function_signature(*f_iter) << endl << "  die 'implement interface';\n}"
               << endl << endl;
  }
  indent_down();
}